

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

string * __thiscall
pbrt::WindyTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,WindyTexture *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::TextureMapping3DHandle_const&>
            (__return_storage_ptr__,"[ WindyTexture mapping: %s ]",&this->mapping);
  return __return_storage_ptr__;
}

Assistant:

std::string WindyTexture::ToString() const {
    return StringPrintf("[ WindyTexture mapping: %s ]", mapping);
}